

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QString * object_name_for_button(WizardButton which)

{
  ulong size;
  int in_ESI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_QString> *in_stack_ffffffffffffff78;
  QLatin1String *a;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 local_58 [24];
  QLatin1StringView local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  size = (ulong)(in_ESI + 1);
  switch(size) {
  case 0:
  case 10:
    break;
  case 1:
  case 2:
  case 6:
  case 7:
  case 8:
  case 9:
    a = in_RDI;
    local_40 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
    QString::number((int)local_58,in_ESI);
    operator+(a,(QString *)in_RDI);
    QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff78);
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x7b9743);
    QString::~QString((QString *)0x7b974d);
    in_RDI = a;
    break;
  case 3:
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),size);
    break;
  case 4:
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),size);
    break;
  case 5:
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

static QString object_name_for_button(QWizard::WizardButton which)
{
    switch (which) {
    case QWizard::CommitButton:
        return u"qt_wizard_commit"_s;
    case QWizard::FinishButton:
        return u"qt_wizard_finish"_s;
    case QWizard::CancelButton:
        return u"qt_wizard_cancel"_s;
    case QWizard::BackButton:
    case QWizard::NextButton:
    case QWizard::HelpButton:
    case QWizard::CustomButton1:
    case QWizard::CustomButton2:
    case QWizard::CustomButton3:
        // Make navigation buttons detectable as passive interactor in designer
        return "__qt__passive_wizardbutton"_L1 + QString::number(which);
    case QWizard::Stretch:
    case QWizard::NoButton:
    //case QWizard::NStandardButtons:
    //case QWizard::NButtons:
        ;
    }
    Q_UNREACHABLE_RETURN(QString());
}